

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

A__GLTextureFormat getTextureFormat(AGLTextureFormat aformat)

{
  A__GLTextureFormat AVar1;
  int iStack_18;
  AGLTextureFormat aformat_local;
  A__GLTextureFormat tf;
  
  tf.internal = 0;
  _iStack_18 = 0;
  switch(aformat) {
  case AGLTF_Unknown:
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3d5,"!\"Unknown format\"");
    aAppTerminate(-1);
    break;
  case AGLTF_U8_R:
    _iStack_18 = 0x190900001909;
    tf.internal = 0x1401;
    break;
  case AGLTF_U8_RA:
    _iStack_18 = 0x190a0000190a;
    tf.internal = 0x1401;
    break;
  case AGLTF_U8_RGB:
    _iStack_18 = 0x190700001907;
    tf.internal = 0x1401;
    break;
  case AGLTF_U8_RGBA:
    _iStack_18 = 0x190800001908;
    tf.internal = 0x1401;
    break;
  case AGLTF_U565_RGB:
    _iStack_18 = 0x190700001907;
    tf.internal = 0x8363;
    break;
  case AGLTF_U5551_RGBA:
    _iStack_18 = 0x190800001908;
    tf.internal = 0x8034;
    break;
  case AGLTF_U4444_RGBA:
    _iStack_18 = 0x190800001908;
    tf.internal = 0x8033;
    break;
  case AGLTF_F32_R:
    _iStack_18 = 0x19030000822e;
    tf.internal = 0x1406;
    break;
  case AGLTF_F32_RGBA:
    _iStack_18 = 0x190800008814;
    tf.internal = 0x1406;
  }
  if (iStack_18 == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3d7,"tf.internal != 0");
    aAppTerminate(-1);
  }
  AVar1.type = tf.internal;
  AVar1.internal = iStack_18;
  AVar1.format = aformat_local;
  return AVar1;
}

Assistant:

static struct A__GLTextureFormat getTextureFormat(AGLTextureFormat aformat) {
	struct A__GLTextureFormat tf = {0};
	switch (aformat) {
	case AGLTF_U8_R:
		tf.internal = tf.format = GL_LUMINANCE;
		tf.type = GL_UNSIGNED_BYTE;
		break;
	case AGLTF_U8_RA:
		tf.internal = tf.format = GL_LUMINANCE_ALPHA;
		tf.type = GL_UNSIGNED_BYTE;
		break;
	case AGLTF_U8_RGB:
		tf.internal = tf.format = GL_RGB;
		tf.type = GL_UNSIGNED_BYTE;
		break;
	case AGLTF_U8_RGBA:
		tf.internal = tf.format = GL_RGBA;
		tf.type = GL_UNSIGNED_BYTE;
		break;
	case AGLTF_U565_RGB:
		tf.internal = tf.format = GL_RGB;
		tf.type = GL_UNSIGNED_SHORT_5_6_5;
		break;
	case AGLTF_U5551_RGBA:
		tf.internal = tf.format = GL_RGBA;
		tf.type = GL_UNSIGNED_SHORT_5_5_5_1;
		break;
	case AGLTF_U4444_RGBA:
		tf.internal = tf.format = GL_RGBA;
		tf.type = GL_UNSIGNED_SHORT_4_4_4_4;
		break;
	case AGLTF_F32_R:
#ifdef GL_R32F
		tf.internal = GL_R32F;
		tf.format = GL_RED;
		tf.type = GL_FLOAT;
#else
		ATTO_ASSERT(!"Unknown format");
#endif
		break;
	case AGLTF_F32_RGBA:
#ifdef GL_RGBA32F
		tf.internal = GL_RGBA32F;
		tf.format = GL_RGBA;
		tf.type = GL_FLOAT;
#else
		ATTO_ASSERT(!"Unknown format");
#endif
		break;
	case AGLTF_Unknown: ATTO_ASSERT(!"Unknown format");
	}
	ATTO_ASSERT(tf.internal != 0);
	return tf;
}